

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O3

void llvm::APInt::sdivrem(APInt *LHS,int64_t RHS,APInt *Quotient,int64_t *Remainder)

{
  bool bVar1;
  anon_union_8_2_1313ab2f_for_U aVar2;
  ulong uVar3;
  uint64_t R;
  uint64_t local_68;
  anon_union_8_2_1313ab2f_for_U local_60;
  uint local_58;
  anon_union_8_2_1313ab2f_for_U local_50;
  uint local_48;
  anon_union_8_2_1313ab2f_for_U local_40;
  uint local_38;
  
  local_68 = *Remainder;
  bVar1 = operator[](LHS,LHS->BitWidth - 1);
  if (bVar1) {
    if (RHS < 0) {
      local_48 = LHS->BitWidth;
      if ((ulong)local_48 < 0x41) {
        aVar2 = LHS->U;
      }
      else {
        uVar3 = (ulong)((uint)((ulong)local_48 + 0x3f >> 3) & 0xfffffff8);
        aVar2.pVal = (uint64_t *)operator_new__(uVar3);
        memcpy(aVar2.pVal,(LHS->U).pVal,uVar3);
      }
      local_50 = aVar2;
      flipAllBits((APInt *)&local_50);
      operator++((APInt *)&local_50);
      local_38 = local_48;
      local_40.VAL = local_50.VAL;
      local_48 = 0;
      udivrem((APInt *)&local_40,-RHS,Quotient,&local_68);
      if ((0x40 < local_38) && (local_40.VAL != 0)) {
        operator_delete__(local_40.pVal);
      }
      if ((0x40 < local_48) && (local_50.VAL != 0)) {
        operator_delete__(local_50.pVal);
      }
    }
    else {
      local_58 = LHS->BitWidth;
      if ((ulong)local_58 < 0x41) {
        aVar2 = LHS->U;
      }
      else {
        uVar3 = (ulong)((uint)((ulong)local_58 + 0x3f >> 3) & 0xfffffff8);
        aVar2.pVal = (uint64_t *)operator_new__(uVar3);
        memcpy(aVar2.pVal,(LHS->U).pVal,uVar3);
      }
      local_60 = aVar2;
      flipAllBits((APInt *)&local_60);
      operator++((APInt *)&local_60);
      local_38 = local_58;
      local_40.VAL = local_60.VAL;
      local_58 = 0;
      udivrem((APInt *)&local_40,RHS,Quotient,&local_68);
      if ((0x40 < local_38) && (local_40.VAL != 0)) {
        operator_delete__(local_40.pVal);
      }
      if ((0x40 < local_58) && (local_60.VAL != 0)) {
        operator_delete__(local_60.pVal);
      }
      flipAllBits(Quotient);
      operator++(Quotient);
    }
    local_68 = -local_68;
  }
  else if (RHS < 0) {
    udivrem(LHS,-RHS,Quotient,&local_68);
    flipAllBits(Quotient);
    operator++(Quotient);
  }
  else {
    udivrem(LHS,RHS,Quotient,&local_68);
  }
  *Remainder = local_68;
  return;
}

Assistant:

void APInt::sdivrem(const APInt &LHS, int64_t RHS,
                    APInt &Quotient, int64_t &Remainder) {
  uint64_t R = Remainder;
  if (LHS.isNegative()) {
    if (RHS < 0)
      APInt::udivrem(-LHS, -RHS, Quotient, R);
    else {
      APInt::udivrem(-LHS, RHS, Quotient, R);
      Quotient.negate();
    }
    R = -R;
  } else if (RHS < 0) {
    APInt::udivrem(LHS, -RHS, Quotient, R);
    Quotient.negate();
  } else {
    APInt::udivrem(LHS, RHS, Quotient, R);
  }
  Remainder = R;
}